

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O1

void Refal2::CUnitList::Print
               (CUnitNode *begin,CUnitNode *end,ostream *outputStream,CPrintHelper *printHelper)

{
  if (begin == (CUnitNode *)0x0) {
    __assert_fail("begin != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                  ,100,
                  "static void Refal2::CUnitList::Print(const CUnitNode *, const CUnitNode *, std::ostream &, const CPrintHelper &)"
                 );
  }
  if (end == (CUnitNode *)0x0) {
    __assert_fail("end != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                  ,0x65,
                  "static void Refal2::CUnitList::Print(const CUnitNode *, const CUnitNode *, std::ostream &, const CPrintHelper &)"
                 );
  }
  do {
    CUnit::Print(&begin->super_CUnit,outputStream,printHelper);
    if (begin == end) {
      return;
    }
    begin = begin->next;
  } while (begin != (CNode<Refal2::CUnit> *)0x0);
  __assert_fail("node != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                ,0x6a,
                "static void Refal2::CUnitList::Print(const CUnitNode *, const CUnitNode *, std::ostream &, const CPrintHelper &)"
               );
}

Assistant:

void CUnitList::Print( const CUnitNode* begin, const CUnitNode* end,
	std::ostream& outputStream,	const CPrintHelper& printHelper )
{
	assert( begin != nullptr );
	assert( end != nullptr );
	const CUnitNode* node = begin;
	while( node != end ) {
		node->Print( outputStream, printHelper );
		node = node->Next();
		assert( node != nullptr );
	}
	node->Print( outputStream, printHelper );
}